

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

size_t cs_disasm(csh ud,uint8_t *buffer,size_t size,uint64_t offset,size_t count,cs_insn **insn)

{
  char cVar1;
  cs_insn *pcVar2;
  cs_detail *pcVar3;
  size_t __n;
  cs_insn *pcVar4;
  size_t sVar5;
  cs_insn *pcVar6;
  long lVar7;
  size_t sVar8;
  uint8_t *buffer_00;
  cs_detail **ppcVar9;
  uint64_t uVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint16_t insn_size;
  MCInst mci;
  SStream ss;
  uint16_t local_5ca;
  cs_insn *local_5c8;
  ulong local_5c0;
  size_t local_5b8;
  size_t local_5b0;
  cs_insn **local_5a8;
  size_t local_5a0;
  size_t local_598;
  size_t local_590;
  uint8_t *local_588;
  uint64_t local_580;
  size_t local_578;
  long local_570;
  MCInst local_568;
  SStream local_234;
  
  if (ud == 0) {
    return 0;
  }
  *(undefined4 *)(ud + 0x58) = 0;
  if (*(int *)ud == 0) {
    *(undefined4 *)(ud + 100) = 0;
  }
  uVar15 = 0x20;
  if (count - 1 < 0x20) {
    uVar15 = count & 0xffffffff;
  }
  local_590 = size;
  local_588 = buffer;
  local_580 = offset;
  pcVar2 = (cs_insn *)(*cs_mem_malloc)(uVar15 * 0xf0);
  if (pcVar2 == (cs_insn *)0x0) {
LAB_00143b94:
    *(undefined4 *)(ud + 0x58) = 1;
    return 0;
  }
  if (local_590 != 0) {
    uVar13 = 0;
    sVar8 = 1;
    lVar7 = 0xf0;
    local_5b0 = local_590;
    sVar5 = 0;
    buffer_00 = local_588;
    uVar10 = local_580;
    local_5c8 = pcVar2;
    local_5a8 = insn;
    local_5a0 = uVar15 * 0xf0;
    local_578 = count;
    do {
      uVar14 = (uint)uVar15;
      local_5c0 = uVar13;
      local_5b8 = sVar8;
      local_598 = sVar5;
      local_570 = lVar7;
      MCInst_Init(&local_568);
      local_568.address = uVar10;
      local_568.csh = (cs_struct *)ud;
      if (*(int *)(ud + 0x68) == 0) {
        pcVar3 = (cs_detail *)0x0;
      }
      else {
        pcVar3 = (cs_detail *)(*cs_mem_malloc)(0x5f8);
      }
      pcVar2->detail = pcVar3;
      pcVar2->address = uVar10;
      local_568.flat_insn = pcVar2;
      cVar1 = (**(code **)(ud + 0x18))
                        (ud,buffer_00,local_5b0,&local_568,&local_5ca,uVar10,
                         *(undefined8 *)(ud + 0x20));
      if (cVar1 == '\0') {
        if (*(int *)(ud + 0x68) != 0) {
          (*cs_mem_free)(pcVar2->detail);
        }
        sVar11 = local_598;
        uVar13 = local_5c0;
        if (*(char *)(ud + 0x88) != '\x01') break;
        __n = (size_t)*(byte *)(ud + 0x89);
        if (local_5b0 < __n) {
          sVar11 = local_5b8 - 1;
          break;
        }
        if ((*(code **)(ud + 0x98) != (code *)0x0) &&
           (__n = (**(code **)(ud + 0x98))
                            (local_588,local_590,uVar10 - local_580,*(undefined8 *)(ud + 0xa0)),
           sVar11 = local_598, uVar13 = local_5c0, local_5b0 <= __n - 1)) break;
        pcVar2->id = 0;
        pcVar2->address = uVar10;
        pcVar2->size = (uint16_t)__n;
        memcpy(pcVar2->bytes,buffer_00,__n);
        strncpy(pcVar2->mnemonic,*(char **)(ud + 0x90),0x1f);
        skipdata_opstr(pcVar2->op_str,buffer_00,__n);
        pcVar2->detail = (cs_detail *)0x0;
      }
      else {
        SStream_Init(&local_234);
        (local_568.flat_insn)->size = local_5ca;
        (**(code **)(ud + 0x48))(ud,pcVar2,local_568.Opcode);
        (**(code **)(ud + 8))(&local_568,&local_234,*(undefined8 *)(ud + 0x10));
        fill_insn((cs_struct *)ud,pcVar2,local_234.buffer,&local_568,*(PostPrinter_t *)(ud + 0x50),
                  buffer_00);
        __n = (size_t)local_5ca;
      }
      pcVar6 = local_5c8;
      uVar12 = (int)local_5c0 + 1;
      uVar13 = (ulong)uVar12;
      sVar11 = local_578;
      if (local_578 != 0 && local_578 == local_5b8) goto LAB_00143ad2;
      if (uVar12 == uVar14) {
        uVar15 = (ulong)(uVar14 << 3) / 5;
        local_5a0 = local_5a0 + uVar15 * 0xf0;
        pcVar4 = (cs_insn *)(*cs_mem_realloc)(local_5c8,local_5a0);
        if (pcVar4 == (cs_insn *)0x0) {
          if (local_5b8 != 0 && *(int *)(ud + 0x68) != 0) {
            ppcVar9 = &pcVar6->detail;
            sVar5 = local_5b8;
            do {
              (*cs_mem_free)(*ppcVar9);
              ppcVar9 = ppcVar9 + 0x1e;
              sVar5 = sVar5 - 1;
            } while (sVar5 != 0);
          }
          (*cs_mem_free)(pcVar6);
          *local_5a8 = (cs_insn *)0x0;
          goto LAB_00143b94;
        }
        pcVar2 = (cs_insn *)(pcVar4->bytes + local_570 + -0x12);
        uVar13 = 0;
        local_5c8 = pcVar4;
      }
      else {
        pcVar2 = pcVar2 + 1;
      }
      uVar14 = (uint)uVar15;
      buffer_00 = buffer_00 + __n;
      uVar10 = uVar10 + __n;
      sVar8 = local_5b8 + 1;
      lVar7 = local_570 + 0xf0;
      sVar5 = local_598 + 1;
      local_5b0 = local_5b0 - __n;
      sVar11 = local_5b8;
    } while (local_5b0 != 0);
    uVar12 = (uint)uVar13;
    insn = local_5a8;
    pcVar2 = local_5c8;
    if (sVar11 != 0) {
LAB_00143ad2:
      insn = local_5a8;
      pcVar2 = local_5c8;
      pcVar6 = local_5c8;
      if ((uVar14 - uVar12 != 0) &&
         (pcVar6 = (cs_insn *)
                   (*cs_mem_realloc)(local_5c8,(ulong)(uVar14 - uVar12) * -0xf0 + local_5a0),
         pcVar6 == (cs_insn *)0x0)) {
        if (*(int *)(ud + 0x68) != 0) {
          ppcVar9 = &pcVar2->detail;
          do {
            (*cs_mem_free)(*ppcVar9);
            ppcVar9 = ppcVar9 + 0x1e;
            sVar11 = sVar11 - 1;
          } while (sVar11 != 0);
        }
        (*cs_mem_free)(pcVar2);
        *insn = (cs_insn *)0x0;
        goto LAB_00143b94;
      }
      goto LAB_00143b04;
    }
  }
  (*cs_mem_free)(pcVar2);
  sVar11 = 0;
  pcVar6 = (cs_insn *)0x0;
LAB_00143b04:
  *insn = pcVar6;
  return sVar11;
}

Assistant:

CAPSTONE_API cs_disasm(csh ud, const uint8_t *buffer, size_t size, uint64_t offset, size_t count, cs_insn **insn)
{
	struct cs_struct *handle;
	MCInst mci;
	uint16_t insn_size;
	size_t c = 0, i;
	unsigned int f = 0;	// index of the next instruction in the cache
	cs_insn *insn_cache;	// cache contains disassembled instructions
	void *total = NULL;
	size_t total_size = 0;	// total size of output buffer containing all insns
	bool r;
	void *tmp;
	size_t skipdata_bytes;
	uint64_t offset_org; // save all the original info of the buffer
	size_t size_org;
	const uint8_t *buffer_org;
	unsigned int cache_size = INSN_CACHE_SIZE;
	size_t next_offset;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		// FIXME: how to handle this case:
		// handle->errnum = CS_ERR_HANDLE;
		return 0;
	}

	handle->errnum = CS_ERR_OK;

	// reset IT block of ARM structure
	if (handle->arch == CS_ARCH_ARM)
		handle->ITBlock.size = 0;

#ifdef CAPSTONE_USE_SYS_DYN_MEM
	if (count > 0 && count <= INSN_CACHE_SIZE)
		cache_size = (unsigned int) count;
#endif

	// save the original offset for SKIPDATA
	buffer_org = buffer;
	offset_org = offset;
	size_org = size;

	total_size = sizeof(cs_insn) * cache_size;
	total = cs_mem_malloc(total_size);
	if (total == NULL) {
		// insufficient memory
		handle->errnum = CS_ERR_MEM;
		return 0;
	}

	insn_cache = total;

	while (size > 0) {
		MCInst_Init(&mci);
		mci.csh = handle;

		// relative branches need to know the address & size of current insn
		mci.address = offset;

		if (handle->detail) {
			// allocate memory for @detail pointer
			insn_cache->detail = cs_mem_malloc(sizeof(cs_detail));
		} else {
			insn_cache->detail = NULL;
		}

		// save all the information for non-detailed mode
		mci.flat_insn = insn_cache;
		mci.flat_insn->address = offset;
#ifdef CAPSTONE_DIET
		// zero out mnemonic & op_str
		mci.flat_insn->mnemonic[0] = '\0';
		mci.flat_insn->op_str[0] = '\0';
#endif

		r = handle->disasm(ud, buffer, size, &mci, &insn_size, offset, handle->getinsn_info);
		if (r) {
			SStream ss;
			SStream_Init(&ss);

			mci.flat_insn->size = insn_size;

			// map internal instruction opcode to public insn ID
			handle->insn_id(handle, insn_cache, mci.Opcode);

			handle->printer(&mci, &ss, handle->printer_info);

			fill_insn(handle, insn_cache, ss.buffer, &mci, handle->post_printer, buffer);

			next_offset = insn_size;
		} else	{
			// encounter a broken instruction

			// free memory of @detail pointer
			if (handle->detail) {
				cs_mem_free(insn_cache->detail);
			}

			// if there is no request to skip data, or remaining data is too small,
			// then bail out
			if (!handle->skipdata || handle->skipdata_size > size)
				break;

			if (handle->skipdata_setup.callback) {
				skipdata_bytes = handle->skipdata_setup.callback(buffer_org, size_org,
						(size_t)(offset - offset_org), handle->skipdata_setup.user_data);
				if (skipdata_bytes > size)
					// remaining data is not enough
					break;

				if (!skipdata_bytes)
					// user requested not to skip data, so bail out
					break;
			} else
				skipdata_bytes = handle->skipdata_size;

			// we have to skip some amount of data, depending on arch & mode
			insn_cache->id = 0;	// invalid ID for this "data" instruction
			insn_cache->address = offset;
			insn_cache->size = (uint16_t)skipdata_bytes;
			memcpy(insn_cache->bytes, buffer, skipdata_bytes);
			strncpy(insn_cache->mnemonic, handle->skipdata_setup.mnemonic,
					sizeof(insn_cache->mnemonic) - 1);
			skipdata_opstr(insn_cache->op_str, buffer, skipdata_bytes);
			insn_cache->detail = NULL;

			next_offset = skipdata_bytes;
		}

		// one more instruction entering the cache
		f++;

		// one more instruction disassembled
		c++;
		if (count > 0 && c == count)
			// already got requested number of instructions
			break;

		if (f == cache_size) {
			// full cache, so expand the cache to contain incoming insns
			cache_size = cache_size * 8 / 5; // * 1.6 ~ golden ratio
			total_size += (sizeof(cs_insn) * cache_size);
			tmp = cs_mem_realloc(total, total_size);
			if (tmp == NULL) {	// insufficient memory
				if (handle->detail) {
					insn_cache = (cs_insn *)total;
					for (i = 0; i < c; i++, insn_cache++)
						cs_mem_free(insn_cache->detail);
				}

				cs_mem_free(total);
				*insn = NULL;
				handle->errnum = CS_ERR_MEM;
				return 0;
			}

			total = tmp;
			// continue to fill in the cache after the last instruction
			insn_cache = (cs_insn *)((char *)total + sizeof(cs_insn) * c);

			// reset f back to 0, so we fill in the cache from begining
			f = 0;
		} else
			insn_cache++;

		buffer += next_offset;
		size -= next_offset;
		offset += next_offset;
	}

	if (!c) {
		// we did not disassemble any instruction
		cs_mem_free(total);
		total = NULL;
	} else if (f != cache_size) {
		// total did not fully use the last cache, so downsize it
		tmp = cs_mem_realloc(total, total_size - (cache_size - f) * sizeof(*insn_cache));
		if (tmp == NULL) {	// insufficient memory
			// free all detail pointers
			if (handle->detail) {
				insn_cache = (cs_insn *)total;
				for (i = 0; i < c; i++, insn_cache++)
					cs_mem_free(insn_cache->detail);
			}

			cs_mem_free(total);
			*insn = NULL;

			handle->errnum = CS_ERR_MEM;
			return 0;
		}

		total = tmp;
	}

	*insn = total;

	return c;
}